

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O0

void __thiscall
QTriangulator<unsigned_short>::ComplexToSimple::fillPriorityQueue(ComplexToSimple *this)

{
  long lVar1;
  QDataBuffer<QPodPoint> *pQVar2;
  bool bVar3;
  qsizetype qVar4;
  Edge *pEVar5;
  QPodPoint *this_00;
  QPodPoint *other;
  int *piVar6;
  Event *__first;
  Event *__last;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  int i;
  Event lowerEvent;
  Event upperEvent;
  QPodPoint lower;
  QPodPoint upper;
  Event *in_stack_ffffffffffffff58;
  QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event> *in_stack_ffffffffffffff60;
  QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event> *this_01;
  int local_44;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event>::reset
            ((QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event> *)(in_RDI + 6));
  QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge>::size
            ((QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge> *)(in_RDI + 1));
  QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event>::reserve
            (in_stack_ffffffffffffff60,(qsizetype)in_stack_ffffffffffffff58);
  for (local_44 = 0;
      qVar4 = QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge>::size
                        ((QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge> *)
                         (in_RDI + 1)), local_44 < qVar4; local_44 = local_44 + 1) {
    pQVar2 = (QDataBuffer<QPodPoint> *)*in_RDI;
    pEVar5 = QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge>::at
                       ((QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge> *)
                        (in_RDI + 1),(long)local_44);
    this_00 = QDataBuffer<QPodPoint>::at(pQVar2,(long)pEVar5->to);
    pQVar2 = (QDataBuffer<QPodPoint> *)*in_RDI;
    pEVar5 = QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge>::at
                       ((QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge> *)
                        (in_RDI + 1),(long)local_44);
    other = QDataBuffer<QPodPoint>::at(pQVar2,(long)pEVar5->from);
    bVar3 = QPodPoint::operator!=(this_00,other);
    if (bVar3) {
      pQVar2 = (QDataBuffer<QPodPoint> *)*in_RDI;
      pEVar5 = QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge>::at
                         ((QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge> *)
                          (in_RDI + 1),(long)local_44);
      piVar6 = Edge::upper(pEVar5);
      QDataBuffer<QPodPoint>::at(pQVar2,(long)*piVar6);
      pQVar2 = (QDataBuffer<QPodPoint> *)*in_RDI;
      pEVar5 = QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge>::at
                         ((QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Edge> *)
                          (in_RDI + 1),(long)local_44);
      piVar6 = Edge::lower(pEVar5);
      QDataBuffer<QPodPoint>::at(pQVar2,(long)*piVar6);
      QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event>::add
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event>::add
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
  }
  this_01 = (QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event> *)(in_RDI + 6);
  __first = QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event>::data(this_01);
  __last = QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event>::data(this_01);
  QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event>::size(this_01);
  std::sort<QTriangulator<unsigned_short>::ComplexToSimple::Event*>(__first,__last);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTriangulator<T>::ComplexToSimple::fillPriorityQueue()
{
    m_events.reset();
    m_events.reserve(m_edges.size() * 2);
    for (int i = 0; i < m_edges.size(); ++i) {
        Q_ASSERT(m_edges.at(i).previous == -1 && m_edges.at(i).next == -1);
        Q_ASSERT(m_edges.at(i).node == nullptr);
        Q_ASSERT(m_edges.at(i).pointingUp == m_edges.at(i).originallyPointingUp);
        Q_ASSERT(m_edges.at(i).pointingUp == (m_parent->m_vertices.at(m_edges.at(i).to) < m_parent->m_vertices.at(m_edges.at(i).from)));
        // Ignore zero-length edges.
        if (m_parent->m_vertices.at(m_edges.at(i).to) != m_parent->m_vertices.at(m_edges.at(i).from)) {
            QPodPoint upper = m_parent->m_vertices.at(m_edges.at(i).upper());
            QPodPoint lower = m_parent->m_vertices.at(m_edges.at(i).lower());
            Event upperEvent = {{upper.x, upper.y}, Event::Upper, i};
            Event lowerEvent = {{lower.x, lower.y}, Event::Lower, i};
            m_events.add(upperEvent);
            m_events.add(lowerEvent);
        }
    }

    std::sort(m_events.data(), m_events.data() + m_events.size());
}